

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

void __thiscall
TinyProcessLib::Process::Process
          (Process *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,string_type *path,environment_type *environment,
          function<void_(const_char_*,_unsigned_long)> *read_stdout,
          function<void_(const_char_*,_unsigned_long)> *read_stderr,bool open_stdin,Config *config)

{
  undefined7 uVar1;
  bool open_stdin_local;
  function<void_(const_char_*,_unsigned_long)> *read_stderr_local;
  function<void_(const_char_*,_unsigned_long)> *read_stdout_local;
  environment_type *environment_local;
  string_type *path_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  Process *this_local;
  
  Data::Data(&this->data);
  this->closed = true;
  std::mutex::mutex(&this->close_mutex);
  std::function<void_(const_char_*,_unsigned_long)>::function(&this->read_stdout,read_stdout);
  std::function<void_(const_char_*,_unsigned_long)>::function(&this->read_stderr,read_stderr);
  std::thread::thread(&this->stdout_stderr_thread);
  this->open_stdin = open_stdin;
  std::mutex::mutex(&this->stdin_mutex);
  (this->config).buffer_size = config->buffer_size;
  uVar1 = *(undefined7 *)&config->field_0x9;
  (this->config).inherit_file_descriptors = config->inherit_file_descriptors;
  *(undefined7 *)&(this->config).field_0x9 = uVar1;
  std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>
            ((unique_ptr<int,std::default_delete<int>> *)&this->stdout_fd);
  std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>
            ((unique_ptr<int,std::default_delete<int>> *)&this->stderr_fd);
  std::unique_ptr<int,std::default_delete<int>>::unique_ptr<std::default_delete<int>,void>
            ((unique_ptr<int,std::default_delete<int>> *)&this->stdin_fd);
  open(this,(char *)arguments,(int)path,environment);
  async_read(this);
  return;
}

Assistant:

Process::Process(const std::vector<string_type> &arguments, const string_type &path,
                 const environment_type &environment,
                 std::function<void(const char *bytes, size_t n)> read_stdout,
                 std::function<void(const char *bytes, size_t n)> read_stderr,
                 bool open_stdin, const Config &config) noexcept
    : closed(true), read_stdout(std::move(read_stdout)), read_stderr(std::move(read_stderr)), open_stdin(open_stdin), config(config) {
  open(arguments, path, &environment);
  async_read();
}